

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

Vector3d * gmath::averageAngleAxis(Vector3d *__return_storage_ptr__,int n,Vector3d *v)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int i;
  long lVar4;
  Vector3d *pVVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  int k_1;
  double (*padVar7) [3];
  long lVar8;
  double (*padVar9) [3];
  int j;
  long lVar10;
  int i_5;
  double ret;
  Matrix33d R;
  Vector3d N;
  SMatrix<double,_3,_3> ret_2;
  vector<double,_std::allocator<double>_> fvec;
  Matrix33d R0;
  Matrix33d local_170;
  Vector3d local_128;
  Vector3d local_108;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  vector<double,_std::allocator<double>_> local_c0 [3];
  double local_78;
  double dStack_70;
  double local_68;
  
  if (n < 1) {
    __return_storage_ptr__->v[0] = 0.0;
    __return_storage_ptr__->v[1] = 0.0;
    __return_storage_ptr__->v[2] = 0.0;
  }
  else if (n == 2) {
    dVar2 = 0.0;
    lVar4 = 0;
    do {
      dVar2 = dVar2 + v->v[lVar4] * v->v[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    createR((Matrix33d *)&local_78,v,dVar2);
    lVar4 = 0;
    dVar2 = 0.0;
    do {
      dVar1 = v[1].v[lVar4];
      dVar2 = dVar2 + dVar1 * dVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    padVar9 = (double (*) [3])local_c0;
    createR((Matrix33d *)padVar9,v + 1,dVar2);
    lVar4 = 0;
    local_128.v[2] = 0.0;
    local_128.v[0] = 0.0;
    local_128.v[1] = 0.0;
    pVVar5 = &local_108;
    local_f0 = 0;
    local_d0 = 0;
    local_e0 = 0;
    uStack_d8 = 0;
    local_108.v[1] = 0.0;
    local_108.v[2] = 0.0;
    local_108.v[0] = 1.0;
    uStack_e8 = 0x3ff0000000000000;
    local_c8 = 0x3ff0000000000000;
    do {
      lVar8 = 0;
      padVar7 = padVar9;
      do {
        pVVar5->v[lVar8] = (*(double (*) [3])*padVar7)[0];
        lVar8 = lVar8 + 1;
        padVar7 = padVar7 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
      padVar9 = (double (*) [3])(*padVar9 + 1);
    } while (lVar4 != 3);
    local_170.v[1][0] = 0.0;
    local_170.v[1][2] = 0.0;
    local_170.v[2][0] = 0.0;
    local_170.v[0][1] = 0.0;
    local_170.v[0][2] = 0.0;
    local_170.v[2][1] = 0.0;
    local_170.v[0][0] = 1.0;
    local_170.v[1][1] = 1.0;
    local_170.v[2][2] = 1.0;
    pVVar5 = &local_108;
    lVar4 = 0;
    do {
      lVar8 = 0;
      padVar9 = (double (*) [3])&local_78;
      do {
        dVar2 = 0.0;
        lVar10 = 0;
        padVar7 = padVar9;
        do {
          dVar2 = dVar2 + pVVar5->v[lVar10] * (*(double (*) [3])*padVar7)[0];
          lVar10 = lVar10 + 1;
          padVar7 = padVar7 + 1;
        } while (lVar10 != 3);
        local_170.v[lVar4][lVar8] = dVar2;
        lVar8 = lVar8 + 1;
        padVar9 = (double (*) [3])(*padVar9 + 1);
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    dVar2 = recoverAngleAxis(&local_170,&local_128);
    createR((Matrix33d *)local_108.v,&local_128,dVar2 * 0.5);
    local_170.v[1][0] = 0.0;
    local_170.v[1][2] = 0.0;
    local_170.v[2][0] = 0.0;
    local_170.v[0][1] = 0.0;
    local_170.v[0][2] = 0.0;
    local_170.v[2][1] = 0.0;
    local_170.v[0][0] = 1.0;
    local_170.v[1][1] = 1.0;
    local_170.v[2][2] = 1.0;
    pvVar6 = local_c0;
    lVar4 = 0;
    do {
      lVar8 = 0;
      padVar9 = &local_108.v;
      do {
        dVar2 = 0.0;
        lVar10 = 0;
        padVar7 = padVar9;
        do {
          dVar2 = dVar2 + (double)(&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start)[lVar10] *
                          (*(double (*) [3])*padVar7)[0];
          lVar10 = lVar10 + 1;
          padVar7 = padVar7 + 1;
        } while (lVar10 != 3);
        local_170.v[lVar4][lVar8] = dVar2;
        lVar8 = lVar8 + 1;
        padVar9 = (double (*) [3])(*padVar9 + 1);
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pvVar6 = pvVar6 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    local_108.v[2] = 0.0;
    local_108.v[0] = 0.0;
    local_108.v[1] = 0.0;
    dVar2 = recoverAngleAxis(&local_170,&local_108);
    __return_storage_ptr__->v[0] = 0.0;
    __return_storage_ptr__->v[1] = 0.0;
    __return_storage_ptr__->v[2] = 0.0;
    do {
      __return_storage_ptr__->v[lVar4] = local_108.v[lVar4] * dVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  else if (n == 1) {
    __return_storage_ptr__->v[2] = v->v[2];
    dVar2 = v->v[1];
    __return_storage_ptr__->v[0] = v->v[0];
    __return_storage_ptr__->v[1] = dVar2;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (local_c0,(ulong)(uint)n,(allocator_type *)&local_170);
    local_78 = v->v[0];
    dStack_70 = v->v[1];
    local_68 = v->v[2];
    bVar3 = slmdif(anon_unknown_23::averageAngleAxisOpt,n,3,&local_78,
                   local_c0[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,v,1e-09,1e-09,(long *)0x0,(double *)0x0);
    if (bVar3) {
      __return_storage_ptr__->v[0] = local_78;
      __return_storage_ptr__->v[1] = dStack_70;
      __return_storage_ptr__->v[2] = local_68;
    }
    else {
      __return_storage_ptr__->v[0] = 0.0;
      __return_storage_ptr__->v[1] = 0.0;
      __return_storage_ptr__->v[2] = 0.0;
    }
    if (local_c0[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_c0[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d averageAngleAxis(int n, Vector3d v[])
{
  if (n <= 0)
  {
    return Vector3d();
  }

  if (n == 1)
  {
    return v[0];
  }

  if (n == 2)
  {
    Matrix33d R0=createR(v[0]);
    Matrix33d R1=createR(v[1]);

    Vector3d N;
    double phi=recoverAngleAxis(transpose(R1)*R0, N);
    Matrix33d R=R1*createR(N, phi/2);

    return recoverAngleAxis(R);
  }

  // for all n >= 3

  double x[3];
  std::vector<double> fvec(n);

  // taking first rotation as start value

  x[0]=v[0][0];
  x[1]=v[0][1];
  x[2]=v[0][2];

  // optimize

  if (slmdif(averageAngleAxisOpt, n, 3, x, fvec.data(), v, 1e-9, 1e-9))
  {
    return Vector3d(x[0], x[1], x[2]);
  }

  return Vector3d();
}